

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

QPDFObjectHandle __thiscall
QPDF::readObjectAtOffset
          (QPDF *this,bool try_recovery,qpdf_offset_t offset,string *description,QPDFObjGen exp_og,
          QPDFObjGen *og,bool skip_cache_if_in_xref)

{
  string *psVar1;
  bool bVar2;
  int iVar3;
  pointer pMVar4;
  element_type *peVar5;
  QPDFExc *pQVar6;
  char *pcVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_type sVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  undefined7 in_register_00000031;
  string *description_00;
  QPDFObjectHandle QVar10;
  undefined7 in_stack_00000009;
  byte in_stack_00000010;
  QPDFObjectHandle local_5a8;
  QPDFObjGen local_598;
  qpdf_offset_t local_590;
  qpdf_offset_t end_after_space;
  string local_580;
  byte local_559;
  qpdf_offset_t qStack_558;
  char ch;
  qpdf_offset_t end_before_space;
  undefined8 local_548;
  undefined1 local_539;
  qpdf_offset_t new_offset;
  QPDFExc *e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  undefined1 local_3a8 [8];
  QPDFExc e_1;
  string local_320;
  QPDFObjGen local_2fc;
  int local_2f4;
  int local_2f0;
  int generation;
  int objid;
  allocator<char> local_2c1;
  string local_2c0;
  byte local_299;
  undefined1 local_298 [7];
  bool objok;
  Token tobj;
  string local_228;
  byte local_201;
  undefined1 local_200 [7];
  bool genok;
  Token tgen;
  string local_190;
  byte local_169;
  undefined1 local_168 [7];
  bool objidok;
  Token tobjid;
  allocator<char> local_e9;
  string local_e8;
  QPDFExc local_c8;
  QPDF *local_44;
  byte local_3a;
  byte local_39;
  bool check_og;
  QPDFObjGen QStack_38;
  bool skip_cache_if_in_xref_local;
  string *description_local;
  qpdf_offset_t offset_local;
  string *psStack_20;
  bool try_recovery_local;
  QPDF *this_local;
  QPDFObjGen exp_og_local;
  QPDFObjectHandle *oh;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  
  description_00 = (string *)CONCAT71(in_register_00000031,try_recovery);
  offset_local._7_1_ = (byte)offset & 1;
  local_39 = in_stack_00000010 & 1;
  local_3a = 1;
  QStack_38 = exp_og;
  description_local = description;
  psStack_20 = description_00;
  this_local = (QPDF *)og;
  exp_og_local = (QPDFObjGen)this;
  iVar3 = QPDFObjGen::getObj((QPDFObjGen *)&this_local);
  if (iVar3 == 0) {
    local_3a = 0;
    offset_local._7_1_ = 0;
  }
  local_44 = this_local;
  setLastObjectDescription((QPDF *)description_00,(string *)QStack_38,(QPDFObjGen)this_local);
  pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                     ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
                      description_00);
  if ((pMVar4->attempt_recovery & 1U) == 0) {
    offset_local._7_1_ = 0;
  }
  if (description_local == (string *)0x0) {
    QTC::TC("qpdf","QPDF bogus 0 offset",0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"object has offset 0",&local_e9);
    damagedPDF(&local_c8,(QPDF *)description_00,-1,&local_e8);
    warn((QPDF *)description_00,&local_c8);
    QPDFExc::~QPDFExc(&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
    QVar10 = QPDFObjectHandle::newNull();
    _Var9._M_pi = QVar10.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  else {
    pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
                        description_00);
    peVar5 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pMVar4->file);
    (*peVar5->_vptr_InputSource[5])(peVar5,description_local);
    pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
                        description_00);
    peVar5 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )&pMVar4->file);
    readToken((Token *)local_168,(QPDF *)description_00,peVar5,0);
    local_169 = QPDFTokenizer::Token::isInteger((Token *)local_168);
    QTC::TC("qpdf","QPDF check objid",(uint)local_169);
    if ((local_169 & 1) == 0) {
      QTC::TC("qpdf","QPDF expected n n obj",0);
      tgen.error_message.field_2._M_local_buf[0xe] = '\x01';
      pQVar6 = (QPDFExc *)__cxa_allocate_exception(0x80);
      psVar1 = description_local;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_190,"expected n n obj",
                 (allocator<char> *)(tgen.error_message.field_2._M_local_buf + 0xf));
      damagedPDF(pQVar6,(QPDF *)description_00,(qpdf_offset_t)psVar1,&local_190);
      tgen.error_message.field_2._M_local_buf[0xe] = '\0';
      __cxa_throw(pQVar6,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
                        description_00);
    peVar5 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )&pMVar4->file);
    readToken((Token *)local_200,(QPDF *)description_00,peVar5,0);
    local_201 = QPDFTokenizer::Token::isInteger((Token *)local_200);
    QTC::TC("qpdf","QPDF check generation",(uint)local_201);
    if ((local_201 & 1) == 0) {
      tobj.error_message.field_2._M_local_buf[0xe] = '\x01';
      pQVar6 = (QPDFExc *)__cxa_allocate_exception(0x80);
      psVar1 = description_local;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_228,"expected n n obj",
                 (allocator<char> *)(tobj.error_message.field_2._M_local_buf + 0xf));
      damagedPDF(pQVar6,(QPDF *)description_00,(qpdf_offset_t)psVar1,&local_228);
      tobj.error_message.field_2._M_local_buf[0xe] = '\0';
      __cxa_throw(pQVar6,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
                        description_00);
    peVar5 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )&pMVar4->file);
    readToken((Token *)local_298,(QPDF *)description_00,peVar5,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"obj",&local_2c1);
    bVar2 = QPDFTokenizer::Token::isWord((Token *)local_298,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::allocator<char>::~allocator(&local_2c1);
    local_299 = bVar2;
    QTC::TC("qpdf","QPDF check obj",(uint)bVar2);
    if ((local_299 & 1) == 0) {
      generation._2_1_ = 1;
      pQVar6 = (QPDFExc *)__cxa_allocate_exception(0x80);
      psVar1 = description_local;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&objid,"expected n n obj",(allocator<char> *)((long)&generation + 3));
      damagedPDF(pQVar6,(QPDF *)description_00,(qpdf_offset_t)psVar1,(string *)&objid);
      generation._2_1_ = 0;
      __cxa_throw(pQVar6,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    QPDFTokenizer::Token::getValue_abi_cxx11_((Token *)local_168);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    local_2f0 = QUtil::string_to_int(pcVar7);
    QPDFTokenizer::Token::getValue_abi_cxx11_((Token *)local_200);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    local_2f4 = QUtil::string_to_int(pcVar7);
    QPDFObjGen::QPDFObjGen(&local_2fc,local_2f0,local_2f4);
    *(QPDFObjGen *)CONCAT71(in_stack_00000009,skip_cache_if_in_xref) = local_2fc;
    if (local_2f0 == 0) {
      QTC::TC("qpdf","QPDF object id 0",0);
      e_1.message.field_2._M_local_buf[0xe] = '\x01';
      pQVar6 = (QPDFExc *)__cxa_allocate_exception(0x80);
      psVar1 = description_local;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_320,"object with ID 0",
                 (allocator<char> *)(e_1.message.field_2._M_local_buf + 0xf));
      damagedPDF(pQVar6,(QPDF *)description_00,(qpdf_offset_t)psVar1,&local_320);
      e_1.message.field_2._M_local_buf[0xe] = '\0';
      __cxa_throw(pQVar6,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    if (((local_3a & 1) != 0) &&
       (bVar2 = QPDFObjGen::operator!=
                          ((QPDFObjGen *)&this_local,
                           (QPDFObjGen *)CONCAT71(in_stack_00000009,skip_cache_if_in_xref)), bVar2))
    {
      QTC::TC("qpdf","QPDF err wrong objid/generation",0);
      psVar1 = description_local;
      QPDFObjGen::unparse_abi_cxx11_((string *)&e,(QPDFObjGen *)&this_local,' ');
      std::operator+(&local_3e8,"expected ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
      std::operator+(&local_3c8,&local_3e8," obj");
      damagedPDF((QPDFExc *)local_3a8,(QPDF *)description_00,(qpdf_offset_t)psVar1,&local_3c8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::~string((string *)&e);
      if ((offset_local._7_1_ & 1) != 0) {
        pQVar6 = (QPDFExc *)__cxa_allocate_exception(0x80);
        QPDFExc::QPDFExc(pQVar6,(QPDFExc *)local_3a8);
        __cxa_throw(pQVar6,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
      }
      warn((QPDF *)description_00,(QPDFExc *)local_3a8);
      QPDFExc::~QPDFExc((QPDFExc *)local_3a8);
    }
    QPDFTokenizer::Token::~Token((Token *)local_298);
    QPDFTokenizer::Token::~Token((Token *)local_200);
    QPDFTokenizer::Token::~Token((Token *)local_168);
    local_539 = 0;
    local_548 = *(undefined8 *)CONCAT71(in_stack_00000009,skip_cache_if_in_xref);
    readObject(this,description_00,QStack_38);
    end_before_space = *(qpdf_offset_t *)CONCAT71(in_stack_00000009,skip_cache_if_in_xref);
    bVar2 = isUnresolved((QPDF *)description_00,(QPDFObjGen)end_before_space);
    _Var9._M_pi = extraout_RDX;
    if (bVar2) {
      pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
                          description_00);
      peVar5 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&pMVar4->file);
      iVar3 = (*peVar5->_vptr_InputSource[4])();
      qStack_558 = CONCAT44(extraout_var,iVar3);
      do {
        pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
                            description_00);
        peVar5 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&pMVar4->file);
        iVar3 = (*peVar5->_vptr_InputSource[7])(peVar5,&local_559,1);
        if (CONCAT44(extraout_var_00,iVar3) == 0) {
          end_after_space._6_1_ = 1;
          pQVar6 = (QPDFExc *)__cxa_allocate_exception(0x80);
          pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                             ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
                              description_00);
          peVar5 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&pMVar4->file);
          iVar3 = (*peVar5->_vptr_InputSource[4])();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_580,"EOF after endobj",
                     (allocator<char> *)((long)&end_after_space + 7));
          damagedPDF(pQVar6,(QPDF *)description_00,CONCAT44(extraout_var_01,iVar3),&local_580);
          end_after_space._6_1_ = 0;
          __cxa_throw(pQVar6,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
        }
        iVar3 = isspace((uint)local_559);
      } while (iVar3 != 0);
      pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
                          description_00);
      peVar5 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&pMVar4->file);
      (*peVar5->_vptr_InputSource[5])(peVar5,0xffffffffffffffff,1);
      pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
                          description_00);
      peVar5 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&pMVar4->file);
      iVar3 = (*peVar5->_vptr_InputSource[4])();
      local_590 = CONCAT44(extraout_var_02,iVar3);
      if ((local_39 & 1) != 0) {
        pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
                            description_00);
        sVar8 = std::
                map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                ::count(&pMVar4->xref_table,
                        (key_type *)CONCAT71(in_stack_00000009,skip_cache_if_in_xref));
        if (sVar8 != 0) {
          QTC::TC("qpdf","QPDF skipping cache for known unchecked object",0);
          _Var9._M_pi = extraout_RDX_00;
          goto LAB_003816b5;
        }
      }
      local_598 = *(QPDFObjGen *)CONCAT71(in_stack_00000009,skip_cache_if_in_xref);
      QPDFObjectHandle::getObj(&local_5a8);
      updateCache((QPDF *)description_00,local_598,(shared_ptr<QPDFObject> *)&local_5a8,qStack_558,
                  local_590,true);
      std::shared_ptr<QPDFObject>::~shared_ptr((shared_ptr<QPDFObject> *)&local_5a8);
      _Var9._M_pi = extraout_RDX_01;
    }
  }
LAB_003816b5:
  QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var9._M_pi;
  QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::readObjectAtOffset(
    bool try_recovery,
    qpdf_offset_t offset,
    std::string const& description,
    QPDFObjGen exp_og,
    QPDFObjGen& og,
    bool skip_cache_if_in_xref)
{
    bool check_og = true;
    if (exp_og.getObj() == 0) {
        // This method uses an expect object ID of 0 to indicate that we don't know or don't care
        // what the actual object ID is at this offset. This is true when we read the xref stream
        // and linearization hint streams. In this case, we don't verify the expect object
        // ID/generation against what was read from the file. There is also no reason to attempt
        // xref recovery if we get a failure in this case since the read attempt was not triggered
        // by an xref lookup.
        check_og = false;
        try_recovery = false;
    }
    setLastObjectDescription(description, exp_og);

    if (!m->attempt_recovery) {
        try_recovery = false;
    }

    // Special case: if offset is 0, just return null.  Some PDF writers, in particular
    // "Mac OS X 10.7.5 Quartz PDFContext", may store deleted objects in the xref table as
    // "0000000000 00000 n", which is not correct, but it won't hurt anything for us to ignore
    // these.
    if (offset == 0) {
        QTC::TC("qpdf", "QPDF bogus 0 offset", 0);
        warn(damagedPDF(-1, "object has offset 0"));
        return QPDFObjectHandle::newNull();
    }

    m->file->seek(offset, SEEK_SET);
    try {
        QPDFTokenizer::Token tobjid = readToken(*m->file);
        bool objidok = tobjid.isInteger();
        QTC::TC("qpdf", "QPDF check objid", objidok ? 1 : 0);
        if (!objidok) {
            QTC::TC("qpdf", "QPDF expected n n obj");
            throw damagedPDF(offset, "expected n n obj");
        }
        QPDFTokenizer::Token tgen = readToken(*m->file);
        bool genok = tgen.isInteger();
        QTC::TC("qpdf", "QPDF check generation", genok ? 1 : 0);
        if (!genok) {
            throw damagedPDF(offset, "expected n n obj");
        }
        QPDFTokenizer::Token tobj = readToken(*m->file);

        bool objok = tobj.isWord("obj");
        QTC::TC("qpdf", "QPDF check obj", objok ? 1 : 0);

        if (!objok) {
            throw damagedPDF(offset, "expected n n obj");
        }
        int objid = QUtil::string_to_int(tobjid.getValue().c_str());
        int generation = QUtil::string_to_int(tgen.getValue().c_str());
        og = QPDFObjGen(objid, generation);
        if (objid == 0) {
            QTC::TC("qpdf", "QPDF object id 0");
            throw damagedPDF(offset, "object with ID 0");
        }
        if (check_og && (exp_og != og)) {
            QTC::TC("qpdf", "QPDF err wrong objid/generation");
            QPDFExc e = damagedPDF(offset, "expected " + exp_og.unparse(' ') + " obj");
            if (try_recovery) {
                // Will be retried below
                throw e;
            } else {
                // We can try reading the object anyway even if the ID doesn't match.
                warn(e);
            }
        }
    } catch (QPDFExc& e) {
        if (try_recovery) {
            // Try again after reconstructing xref table
            reconstruct_xref(e);
            if (m->xref_table.count(exp_og) && (m->xref_table[exp_og].getType() == 1)) {
                qpdf_offset_t new_offset = m->xref_table[exp_og].getOffset();
                QPDFObjectHandle result =
                    readObjectAtOffset(false, new_offset, description, exp_og, og, false);
                QTC::TC("qpdf", "QPDF recovered in readObjectAtOffset");
                return result;
            } else {
                QTC::TC("qpdf", "QPDF object gone after xref reconstruction");
                warn(damagedPDF(
                    "",
                    -1,
                    ("object " + exp_og.unparse(' ') +
                     " not found in file after regenerating cross reference "
                     "table")));
                return QPDFObjectHandle::newNull();
            }
        } else {
            throw;
        }
    }

    QPDFObjectHandle oh = readObject(description, og);

    if (isUnresolved(og)) {
        // Store the object in the cache here so it gets cached whether we first know the offset or
        // whether we first know the object ID and generation (in which we case we would get here
        // through resolve).

        // Determine the end offset of this object before and after white space.  We use these
        // numbers to validate linearization hint tables.  Offsets and lengths of objects may imply
        // the end of an object to be anywhere between these values.
        qpdf_offset_t end_before_space = m->file->tell();

        // skip over spaces
        while (true) {
            char ch;
            if (m->file->read(&ch, 1)) {
                if (!isspace(static_cast<unsigned char>(ch))) {
                    m->file->seek(-1, SEEK_CUR);
                    break;
                }
            } else {
                throw damagedPDF(m->file->tell(), "EOF after endobj");
            }
        }
        qpdf_offset_t end_after_space = m->file->tell();
        if (skip_cache_if_in_xref && m->xref_table.count(og)) {
            // Ordinarily, an object gets read here when resolved through xref table or stream. In
            // the special case of the xref stream and linearization hint tables, the offset comes
            // from another source. For the specific case of xref streams, the xref stream is read
            // and loaded into the object cache very early in parsing. Ordinarily, when a file is
            // updated by appending, items inserted into the xref table in later updates take
            // precedence over earlier items. In the special case of reusing the object number
            // previously used as the xref stream, we have the following order of events:
            //
            // * reused object gets loaded into the xref table
            // * old object is read here while reading xref streams
            // * original xref entry is ignored (since already in xref table)
            //
            // It is the second step that causes a problem. Even though the xref table is correct in
            // this case, the old object is already in the cache and so effectively prevails over
            // the reused object. To work around this issue, we have a special case for the xref
            // stream (via the skip_cache_if_in_xref): if the object is already in the xref stream,
            // don't cache what we read here.
            //
            // It is likely that the same bug may exist for linearization hint tables, but the
            // existing code uses end_before_space and end_after_space from the cache, so fixing
            // that would require more significant rework. The chances of a linearization hint
            // stream being reused seems smaller because the xref stream is probably the highest
            // object in the file and the linearization hint stream would be some random place in
            // the middle, so I'm leaving that bug unfixed for now. If the bug were to be fixed, we
            // could use !check_og in place of skip_cache_if_in_xref.
            QTC::TC("qpdf", "QPDF skipping cache for known unchecked object");
        } else {
            updateCache(og, oh.getObj(), end_before_space, end_after_space);
        }
    }

    return oh;
}